

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_server_assert(http_server_t *server)

{
  uint __line;
  char *__assertion;
  
  if (server == (http_server_t *)0x0) {
    __assertion = "server != NULL";
    __line = 0x1b;
  }
  else if (server->clients == (http_client_t *)0x0) {
    __assertion = "server->clients != NULL";
    __line = 0x1c;
  }
  else if (server->max_clients < server->count_clients && server->max_clients != 0) {
    __assertion = "(server->max_clients == 0) || (server->count_clients <= server->max_clients)";
    __line = 0x1e;
  }
  else {
    if (server->count_clients <= server->num_clients) {
      return;
    }
    __assertion = "server->count_clients <= server->num_clients";
    __line = 0x1f;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",
                __line,"void http_server_assert(http_server_t *)");
}

Assistant:

static void http_server_assert(http_server_t *server) {
  assert(server != NULL);
  assert(server->clients != NULL);
  assert((server->max_clients == 0) ||
         (server->count_clients <= server->max_clients));
  assert(server->count_clients <= server->num_clients);
}